

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

int __thiscall lightconf::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  initializer_list<int> __l;
  allocator<int> local_75;
  int local_74;
  iterator local_70;
  size_type local_68;
  deque<int,_std::allocator<int>_> local_60;
  writer *local_10;
  writer *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  local_74 = 0;
  local_70 = &local_74;
  local_68 = 1;
  std::allocator<int>::allocator(&local_75);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::deque<int,_std::allocator<int>_>::deque(&local_60,__l,&local_75);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::stack(&this->tabstops,&local_60);
  std::deque<int,_std::allocator<int>_>::~deque(&local_60);
  std::allocator<int>::~allocator(&local_75);
  this->line = 0;
  this->col = 0;
  return (int)this;
}

Assistant:

writer() :
        tabstops({0}),
        line(0),
        col(0)
    { }